

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O0

void __thiscall spdlog::details::thread_pool::~thread_pool(thread_pool *this)

{
  bool bVar1;
  vector<std::thread,_std::allocator<std::thread>_> *pvVar2;
  iterator this_00;
  async_msg *in_RDI;
  thread *t;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  size_t i;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  async_msg *in_stack_fffffffffffffe28;
  thread_pool *in_stack_fffffffffffffe30;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_1c8;
  char *local_1c0;
  async_msg_type in_stack_fffffffffffffe4c;
  async_msg *in_stack_fffffffffffffe50;
  vector<std::thread,_std::allocator<std::thread>_> *local_10;
  
  local_10 = (vector<std::thread,_std::allocator<std::thread>_> *)0x0;
  while( true ) {
    this_01 = local_10;
    pvVar2 = (vector<std::thread,_std::allocator<std::thread>_> *)
             std::vector<std::thread,_std::allocator<std::thread>_>::size
                       ((vector<std::thread,_std::allocator<std::thread>_> *)
                        ((in_RDI->super_log_msg_buffer).buffer.store_ + 0x40));
    if (pvVar2 <= this_01) break;
    async_msg::async_msg(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    post_async_msg_(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                    (async_overflow_policy)((ulong)in_RDI >> 0x20));
    async_msg::~async_msg(in_RDI);
    local_10 = (vector<std::thread,_std::allocator<std::thread>_> *)
               ((long)&(local_10->super__Vector_base<std::thread,_std::allocator<std::thread>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_1c0 = (in_RDI->super_log_msg_buffer).buffer.store_ + 0x40;
  local_1c8._M_current =
       (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::begin(this_01);
  this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)this_01);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_1c8);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_1c8);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00._M_current);
  mpmc_blocking_queue<spdlog::details::async_msg>::~mpmc_blocking_queue
            ((mpmc_blocking_queue<spdlog::details::async_msg> *)in_RDI);
  return;
}

Assistant:

SPDLOG_INLINE thread_pool::~thread_pool()
{
    SPDLOG_TRY
    {
        for (size_t i = 0; i < threads_.size(); i++)
        {
            post_async_msg_(async_msg(async_msg_type::terminate), async_overflow_policy::block);
        }

        for (auto &t : threads_)
        {
            t.join();
        }
    }
    SPDLOG_CATCH_ALL() {}
}

void SPDLOG_INLINE thread_pool::post_log(async_logger_ptr &&worker_ptr, const details::log_msg &msg, async_overflow_policy overflow_policy)
{
    async_msg async_m(std::move(worker_ptr), async_msg_type::log, msg);
    post_async_msg_(std::move(async_m), overflow_policy);
}